

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SOIL.c
# Opt level: O0

uint SOIL_internal_create_OGL_texture
               (uchar *data,int width,int height,int channels,uint reuse_texture_ID,uint flags,
               uint opengl_texture_type,uint opengl_texture_target,uint texture_check_size_enum)

{
  int iVar1;
  byte bVar2;
  undefined8 in_stack_ffffffffffffff10;
  undefined4 uVar3;
  uchar *puStack_c8;
  uint clamp_mode;
  uchar *DDS_data_1;
  uchar *puStack_b8;
  int DDS_size_1;
  uchar *resampled_2;
  int local_a8;
  int MIPheight;
  int MIPwidth;
  int MIPlevel;
  uchar *DDS_data;
  uint local_90;
  int DDS_size;
  int new_height_1;
  int new_width_1;
  int reduce_block_y;
  int reduce_block_x;
  uchar *resampled_1;
  uchar *resampled;
  int local_68;
  int new_height;
  int new_width;
  int i_1;
  int iStack_58;
  uchar temp;
  int index2;
  int index1;
  int j;
  int i;
  int max_supported_size;
  int DXT_mode;
  uint original_texture_format;
  uint internal_texture_format;
  uint tex_id;
  uchar *img;
  uint local_28;
  uint flags_local;
  uint reuse_texture_ID_local;
  int channels_local;
  int height_local;
  int width_local;
  uchar *data_local;
  
  uVar3 = (undefined4)((ulong)in_stack_ffffffffffffff10 >> 0x20);
  DXT_mode = 0;
  max_supported_size = 0;
  i = -1;
  img._4_4_ = flags;
  local_28 = reuse_texture_ID;
  flags_local = channels;
  reuse_texture_ID_local = height;
  channels_local = width;
  _height_local = data;
  if ((flags & 0x200) != 0) {
    iVar1 = query_tex_rectangle_capability();
    if (iVar1 != 1) {
      result_string_pointer = "Texture Rectangle extension unsupported";
      return 0;
    }
    if (opengl_texture_type == 0xde1) {
      img._4_4_ = img._4_4_ & 0xfffffff8;
      opengl_texture_target = 0x84f5;
      opengl_texture_type = 0x84f5;
    }
    else {
      img._4_4_ = img._4_4_ & 0xfffffdff;
    }
  }
  _internal_texture_format =
       (uchar *)malloc((long)(int)(channels_local * reuse_texture_ID_local * flags_local));
  memcpy(_internal_texture_format,_height_local,
         (long)(int)(channels_local * reuse_texture_ID_local * flags_local));
  if ((img._4_4_ & 0x10) != 0) {
    for (index2 = 0; index2 * 2 < (int)reuse_texture_ID_local; index2 = index2 + 1) {
      iStack_58 = index2 * channels_local * flags_local;
      i_1 = ((reuse_texture_ID_local - 1) - index2) * channels_local * flags_local;
      for (index1 = channels_local * flags_local; 0 < index1; index1 = index1 + -1) {
        new_width._3_1_ = _internal_texture_format[iStack_58];
        _internal_texture_format[iStack_58] = _internal_texture_format[i_1];
        _internal_texture_format[i_1] = new_width._3_1_;
        iStack_58 = iStack_58 + 1;
        i_1 = i_1 + 1;
      }
    }
  }
  if ((img._4_4_ & 0x80) != 0) {
    scale_image_RGB_to_NTSC_safe
              (_internal_texture_format,channels_local,reuse_texture_ID_local,flags_local);
  }
  if ((img._4_4_ & 8) != 0) {
    if (flags_local == 2) {
      for (new_height = 0; new_height < (int)(channels_local * 2 * reuse_texture_ID_local);
          new_height = new_height + 2) {
        _internal_texture_format[new_height] =
             (uchar)((uint)_internal_texture_format[new_height] *
                     (uint)_internal_texture_format[new_height + 1] + 0x80 >> 8);
      }
    }
    else if (flags_local == 4) {
      for (new_height = 0; new_height < (int)(channels_local * 4 * reuse_texture_ID_local);
          new_height = new_height + 4) {
        _internal_texture_format[new_height] =
             (uchar)((uint)_internal_texture_format[new_height] *
                     (uint)_internal_texture_format[new_height + 3] + 0x80 >> 8);
        _internal_texture_format[new_height + 1] =
             (uchar)((uint)_internal_texture_format[new_height + 1] *
                     (uint)_internal_texture_format[new_height + 3] + 0x80 >> 8);
        _internal_texture_format[new_height + 2] =
             (uchar)((uint)_internal_texture_format[new_height + 2] *
                     (uint)_internal_texture_format[new_height + 3] + 0x80 >> 8);
      }
    }
  }
  iVar1 = query_NPOT_capability();
  if ((iVar1 == 0) && ((img._4_4_ & 0x200) == 0)) {
    img._4_4_ = img._4_4_ | 1;
  }
  glGetIntegerv(texture_check_size_enum,&j);
  if (((((img._4_4_ & 1) != 0) || ((img._4_4_ & 2) != 0)) || (j < channels_local)) ||
     (j < (int)reuse_texture_ID_local)) {
    resampled._4_4_ = 1;
    for (local_68 = 1; local_68 < channels_local; local_68 = local_68 << 1) {
    }
    for (; (int)resampled._4_4_ < (int)reuse_texture_ID_local;
        resampled._4_4_ = resampled._4_4_ << 1) {
    }
    if ((local_68 != channels_local) || (resampled._4_4_ != reuse_texture_ID_local)) {
      resampled_1 = (uchar *)malloc((long)(int)(flags_local * local_68 * resampled._4_4_));
      up_scale_image(_internal_texture_format,channels_local,reuse_texture_ID_local,flags_local,
                     resampled_1,local_68,resampled._4_4_);
      SOIL_free_image_data(_internal_texture_format);
      _internal_texture_format = resampled_1;
      channels_local = local_68;
      reuse_texture_ID_local = resampled._4_4_;
    }
  }
  if ((j < channels_local) || (j < (int)reuse_texture_ID_local)) {
    new_width_1 = 1;
    new_height_1 = 1;
    if (j < channels_local) {
      new_width_1 = channels_local / j;
    }
    if (j < (int)reuse_texture_ID_local) {
      new_height_1 = (int)reuse_texture_ID_local / j;
    }
    DDS_size = channels_local / new_width_1;
    local_90 = (int)reuse_texture_ID_local / new_height_1;
    _reduce_block_y = (uchar *)malloc((long)(int)(flags_local * DDS_size * local_90));
    mipmap_image(_internal_texture_format,channels_local,reuse_texture_ID_local,flags_local,
                 _reduce_block_y,new_width_1,new_height_1);
    SOIL_free_image_data(_internal_texture_format);
    _internal_texture_format = _reduce_block_y;
    channels_local = DDS_size;
    reuse_texture_ID_local = local_90;
  }
  if ((img._4_4_ & 0x100) != 0) {
    convert_RGB_to_YCoCg(_internal_texture_format,channels_local,reuse_texture_ID_local,flags_local)
    ;
  }
  original_texture_format = local_28;
  if (local_28 == 0) {
    glGenTextures(1,&original_texture_format);
  }
  check_for_GL_errors("glGenTextures");
  if (original_texture_format == 0) {
    result_string_pointer = "Failed to generate an OpenGL texture name; missing OpenGL context?";
  }
  else {
    switch(flags_local) {
    case 1:
      max_supported_size = 0x1909;
      break;
    case 2:
      max_supported_size = 0x190a;
      break;
    case 3:
      max_supported_size = 0x1907;
      break;
    case 4:
      max_supported_size = 0x1908;
    }
    DXT_mode = max_supported_size;
    if (((img._4_4_ & 0x20) != 0) && (i = query_DXT_capability(), i == 1)) {
      if ((flags_local & 1) == 1) {
        DXT_mode = 0x83f0;
      }
      else {
        DXT_mode = 0x83f3;
      }
    }
    glBindTexture(opengl_texture_type,original_texture_format);
    check_for_GL_errors("glBindTexture");
    if (i == 1) {
      _MIPwidth = (uchar *)0x0;
      if ((flags_local & 1) == 1) {
        _MIPwidth = convert_image_to_DXT1
                              (_internal_texture_format,channels_local,reuse_texture_ID_local,
                               flags_local,(int *)((long)&DDS_data + 4));
      }
      else {
        _MIPwidth = convert_image_to_DXT5
                              (_internal_texture_format,channels_local,reuse_texture_ID_local,
                               flags_local,(int *)((long)&DDS_data + 4));
      }
      if (_MIPwidth == (uchar *)0x0) {
        glTexImage2D(opengl_texture_target,0,DXT_mode,channels_local,reuse_texture_ID_local,0,
                     max_supported_size,CONCAT44(uVar3,0x1401),_internal_texture_format);
        check_for_GL_errors("glTexImage2D");
      }
      else {
        (*soilGlCompressedTexImage2D)
                  (opengl_texture_target,0,DXT_mode,channels_local,reuse_texture_ID_local,0,
                   DDS_data._4_4_,_MIPwidth);
        check_for_GL_errors("glCompressedTexImage2D");
        SOIL_free_image_data(_MIPwidth);
      }
    }
    else {
      glTexImage2D(opengl_texture_target,0,DXT_mode,channels_local,reuse_texture_ID_local,0,
                   max_supported_size,CONCAT44(uVar3,0x1401),_internal_texture_format);
      check_for_GL_errors("glTexImage2D");
    }
    if ((img._4_4_ & 2) == 0) {
      glTexParameteri(opengl_texture_type,0x2800,0x2601);
      glTexParameteri(opengl_texture_type,0x2801,0x2601);
      check_for_GL_errors("GL_TEXTURE_MIN/MAG_FILTER");
    }
    else {
      MIPheight = 1;
      local_a8 = (channels_local + 1) / 2;
      resampled_2._4_4_ = (int)(reuse_texture_ID_local + 1) / 2;
      puStack_b8 = (uchar *)malloc((long)(int)(flags_local * local_a8 * resampled_2._4_4_));
      while (bVar2 = (byte)MIPheight,
            1 << (bVar2 & 0x1f) <= channels_local ||
            1 << (bVar2 & 0x1f) <= (int)reuse_texture_ID_local) {
        mipmap_image(_internal_texture_format,channels_local,reuse_texture_ID_local,flags_local,
                     puStack_b8,1 << (bVar2 & 0x1f),1 << (bVar2 & 0x1f));
        if (i == 1) {
          if ((flags_local & 1) == 1) {
            puStack_c8 = convert_image_to_DXT1
                                   (puStack_b8,local_a8,resampled_2._4_4_,flags_local,
                                    (int *)((long)&DDS_data_1 + 4));
          }
          else {
            puStack_c8 = convert_image_to_DXT5
                                   (puStack_b8,local_a8,resampled_2._4_4_,flags_local,
                                    (int *)((long)&DDS_data_1 + 4));
          }
          if (puStack_c8 == (uchar *)0x0) {
            glTexImage2D(opengl_texture_target,MIPheight,DXT_mode,local_a8,resampled_2._4_4_,0,
                         max_supported_size,0x1401,puStack_b8);
            check_for_GL_errors("glTexImage2D");
          }
          else {
            (*soilGlCompressedTexImage2D)
                      (opengl_texture_target,MIPheight,DXT_mode,local_a8,resampled_2._4_4_,0,
                       DDS_data_1._4_4_,puStack_c8);
            check_for_GL_errors("glCompressedTexImage2D");
            SOIL_free_image_data(puStack_c8);
          }
        }
        else {
          glTexImage2D(opengl_texture_target,MIPheight,DXT_mode,local_a8,resampled_2._4_4_,0,
                       max_supported_size,0x1401,puStack_b8);
          check_for_GL_errors("glTexImage2D");
        }
        MIPheight = MIPheight + 1;
        local_a8 = (local_a8 + 1) / 2;
        resampled_2._4_4_ = (resampled_2._4_4_ + 1) / 2;
      }
      SOIL_free_image_data(puStack_b8);
      glTexParameteri(opengl_texture_type,0x2800,0x2601);
      glTexParameteri(opengl_texture_type,0x2801,0x2703);
      check_for_GL_errors("GL_TEXTURE_MIN/MAG_FILTER");
    }
    if ((img._4_4_ & 4) == 0) {
      glTexParameteri(opengl_texture_type,0x2802,0x2900);
      glTexParameteri(opengl_texture_type,0x2803,0x2900);
      if (opengl_texture_type == 0x8513) {
        glTexParameteri(0x8513,0x8072,0x2900);
      }
      check_for_GL_errors("GL_TEXTURE_WRAP_*");
    }
    else {
      glTexParameteri(opengl_texture_type,0x2802,0x2901);
      glTexParameteri(opengl_texture_type,0x2803,0x2901);
      if (opengl_texture_type == 0x8513) {
        glTexParameteri(0x8513,0x8072,0x2901);
      }
      check_for_GL_errors("GL_TEXTURE_WRAP_*");
    }
    result_string_pointer = "Image loaded as an OpenGL texture";
  }
  SOIL_free_image_data(_internal_texture_format);
  return original_texture_format;
}

Assistant:

unsigned int
	SOIL_internal_create_OGL_texture
	(
		const unsigned char *const data,
		int width, int height, int channels,
		unsigned int reuse_texture_ID,
		unsigned int flags,
		unsigned int opengl_texture_type,
		unsigned int opengl_texture_target,
		unsigned int texture_check_size_enum
	)
{
	/*	variables	*/
	unsigned char* img;
	unsigned int tex_id;
	unsigned int internal_texture_format = 0, original_texture_format = 0;
	int DXT_mode = SOIL_CAPABILITY_UNKNOWN;
	int max_supported_size;
	/*	If the user wants to use the texture rectangle I kill a few flags	*/
	if( flags & SOIL_FLAG_TEXTURE_RECTANGLE )
	{
		/*	well, the user asked for it, can we do that?	*/
		if( query_tex_rectangle_capability() == SOIL_CAPABILITY_PRESENT )
		{
			/*	only allow this if the user in _NOT_ trying to do a cubemap!	*/
			if( opengl_texture_type == GL_TEXTURE_2D )
			{
				/*	clean out the flags that cannot be used with texture rectangles	*/
				flags &= ~(
						SOIL_FLAG_POWER_OF_TWO | SOIL_FLAG_MIPMAPS |
						SOIL_FLAG_TEXTURE_REPEATS
					);
				/*	and change my target	*/
				opengl_texture_target = SOIL_TEXTURE_RECTANGLE_ARB;
				opengl_texture_type = SOIL_TEXTURE_RECTANGLE_ARB;
			} else
			{
				/*	not allowed for any other uses (yes, I'm looking at you, cubemaps!)	*/
				flags &= ~SOIL_FLAG_TEXTURE_RECTANGLE;
			}

		} else
		{
			/*	can't do it, and that is a breakable offense (uv coords use pixels instead of [0,1]!)	*/
			result_string_pointer = "Texture Rectangle extension unsupported";
			return 0;
		}
	}
	/*	create a copy the image data	*/
	img = (unsigned char*)malloc( width*height*channels );
	memcpy( img, data, width*height*channels );
	/*	does the user want me to invert the image?	*/
	if( flags & SOIL_FLAG_INVERT_Y )
	{
		int i, j;
		for( j = 0; j*2 < height; ++j )
		{
			int index1 = j * width * channels;
			int index2 = (height - 1 - j) * width * channels;
			for( i = width * channels; i > 0; --i )
			{
				unsigned char temp = img[index1];
				img[index1] = img[index2];
				img[index2] = temp;
				++index1;
				++index2;
			}
		}
	}
	/*	does the user want me to scale the colors into the NTSC safe RGB range?	*/
	if( flags & SOIL_FLAG_NTSC_SAFE_RGB )
	{
		scale_image_RGB_to_NTSC_safe( img, width, height, channels );
	}
	/*	does the user want me to convert from straight to pre-multiplied alpha?
		(and do we even _have_ alpha?)	*/
	if( flags & SOIL_FLAG_MULTIPLY_ALPHA )
	{
		int i;
		switch( channels )
		{
		case 2:
			for( i = 0; i < 2*width*height; i += 2 )
			{
				img[i] = (img[i] * img[i+1] + 128) >> 8;
			}
			break;
		case 4:
			for( i = 0; i < 4*width*height; i += 4 )
			{
				img[i+0] = (img[i+0] * img[i+3] + 128) >> 8;
				img[i+1] = (img[i+1] * img[i+3] + 128) >> 8;
				img[i+2] = (img[i+2] * img[i+3] + 128) >> 8;
			}
			break;
		default:
			/*	no other number of channels contains alpha data	*/
			break;
		}
	}
	/*	if the user can't support NPOT textures, make sure we force the POT option	*/
	if( (query_NPOT_capability() == SOIL_CAPABILITY_NONE) &&
		!(flags & SOIL_FLAG_TEXTURE_RECTANGLE) )
	{
		/*	add in the POT flag */
		flags |= SOIL_FLAG_POWER_OF_TWO;
	}
	/*	how large of a texture can this OpenGL implementation handle?	*/
	/*	texture_check_size_enum will be GL_MAX_TEXTURE_SIZE or SOIL_MAX_CUBE_MAP_TEXTURE_SIZE	*/
	glGetIntegerv( texture_check_size_enum, &max_supported_size );
	/*	do I need to make it a power of 2?	*/
	if(
		(flags & SOIL_FLAG_POWER_OF_TWO) ||	/*	user asked for it	*/
		(flags & SOIL_FLAG_MIPMAPS) ||		/*	need it for the MIP-maps	*/
		(width > max_supported_size) ||		/*	it's too big, (make sure it's	*/
		(height > max_supported_size) )		/*	2^n for later down-sampling)	*/
	{
		int new_width = 1;
		int new_height = 1;
		while( new_width < width )
		{
			new_width *= 2;
		}
		while( new_height < height )
		{
			new_height *= 2;
		}
		/*	still?	*/
		if( (new_width != width) || (new_height != height) )
		{
			/*	yep, resize	*/
			unsigned char *resampled = (unsigned char*)malloc( channels*new_width*new_height );
			up_scale_image(
					img, width, height, channels,
					resampled, new_width, new_height );
			/*	OJO	this is for debug only!	*/
			/*
			SOIL_save_image( "\\showme.bmp", SOIL_SAVE_TYPE_BMP,
							new_width, new_height, channels,
							resampled );
			*/
			/*	nuke the old guy, then point it at the new guy	*/
			SOIL_free_image_data( img );
			img = resampled;
			width = new_width;
			height = new_height;
		}
	}
	/*	now, if it is too large...	*/
	if( (width > max_supported_size) || (height > max_supported_size) )
	{
		/*	I've already made it a power of two, so simply use the MIPmapping
			code to reduce its size to the allowable maximum.	*/
		unsigned char *resampled;
		int reduce_block_x = 1, reduce_block_y = 1;
		int new_width, new_height;
		if( width > max_supported_size )
		{
			reduce_block_x = width / max_supported_size;
		}
		if( height > max_supported_size )
		{
			reduce_block_y = height / max_supported_size;
		}
		new_width = width / reduce_block_x;
		new_height = height / reduce_block_y;
		resampled = (unsigned char*)malloc( channels*new_width*new_height );
		/*	perform the actual reduction	*/
		mipmap_image(	img, width, height, channels,
						resampled, reduce_block_x, reduce_block_y );
		/*	nuke the old guy, then point it at the new guy	*/
		SOIL_free_image_data( img );
		img = resampled;
		width = new_width;
		height = new_height;
	}
	/*	does the user want us to use YCoCg color space?	*/
	if( flags & SOIL_FLAG_CoCg_Y )
	{
		/*	this will only work with RGB and RGBA images */
		convert_RGB_to_YCoCg( img, width, height, channels );
		/*
		save_image_as_DDS( "CoCg_Y.dds", width, height, channels, img );
		*/
	}
	/*	create the OpenGL texture ID handle
    	(note: allowing a forced texture ID lets me reload a texture)	*/
    tex_id = reuse_texture_ID;
    if( tex_id == 0 )
    {
		glGenTextures( 1, &tex_id );
    }
	check_for_GL_errors( "glGenTextures" );
	/* Note: sometimes glGenTextures fails (usually no OpenGL context)	*/
	if( tex_id )
	{
		/*	and what type am I using as the internal texture format?	*/
		switch( channels )
		{
		case 1:
			original_texture_format = GL_LUMINANCE;
			break;
		case 2:
			original_texture_format = GL_LUMINANCE_ALPHA;
			break;
		case 3:
			original_texture_format = GL_RGB;
			break;
		case 4:
			original_texture_format = GL_RGBA;
			break;
		}
		internal_texture_format = original_texture_format;
		/*	does the user want me to, and can I, save as DXT?	*/
		if( flags & SOIL_FLAG_COMPRESS_TO_DXT )
		{
			DXT_mode = query_DXT_capability();
			if( DXT_mode == SOIL_CAPABILITY_PRESENT )
			{
				/*	I can use DXT, whether I compress it or OpenGL does	*/
				if( (channels & 1) == 1 )
				{
					/*	1 or 3 channels = DXT1	*/
					internal_texture_format = SOIL_RGB_S3TC_DXT1;
				} else
				{
					/*	2 or 4 channels = DXT5	*/
					internal_texture_format = SOIL_RGBA_S3TC_DXT5;
				}
			}
		}
		/*  bind an OpenGL texture ID	*/
		glBindTexture( opengl_texture_type, tex_id );
		check_for_GL_errors( "glBindTexture" );
		/*  upload the main image	*/
		if( DXT_mode == SOIL_CAPABILITY_PRESENT )
		{
			/*	user wants me to do the DXT conversion!	*/
			int DDS_size;
			unsigned char *DDS_data = NULL;
			if( (channels & 1) == 1 )
			{
				/*	RGB, use DXT1	*/
				DDS_data = convert_image_to_DXT1( img, width, height, channels, &DDS_size );
			} else
			{
				/*	RGBA, use DXT5	*/
				DDS_data = convert_image_to_DXT5( img, width, height, channels, &DDS_size );
			}
			if( DDS_data )
			{
				soilGlCompressedTexImage2D(
					opengl_texture_target, 0,
					internal_texture_format, width, height, 0,
					DDS_size, DDS_data );
				check_for_GL_errors( "glCompressedTexImage2D" );
				SOIL_free_image_data( DDS_data );
				/*	printf( "Internal DXT compressor\n" );	*/
			} else
			{
				/*	my compression failed, try the OpenGL driver's version	*/
				glTexImage2D(
					opengl_texture_target, 0,
					internal_texture_format, width, height, 0,
					original_texture_format, GL_UNSIGNED_BYTE, img );
				check_for_GL_errors( "glTexImage2D" );
				/*	printf( "OpenGL DXT compressor\n" );	*/
			}
		} else
		{
			/*	user want OpenGL to do all the work!	*/
			glTexImage2D(
				opengl_texture_target, 0,
				internal_texture_format, width, height, 0,
				original_texture_format, GL_UNSIGNED_BYTE, img );
			check_for_GL_errors( "glTexImage2D" );
			/*printf( "OpenGL DXT compressor\n" );	*/
		}
		/*	are any MIPmaps desired?	*/
		if( flags & SOIL_FLAG_MIPMAPS )
		{
			int MIPlevel = 1;
			int MIPwidth = (width+1) / 2;
			int MIPheight = (height+1) / 2;
			unsigned char *resampled = (unsigned char*)malloc( channels*MIPwidth*MIPheight );
			while( ((1<<MIPlevel) <= width) || ((1<<MIPlevel) <= height) )
			{
				/*	do this MIPmap level	*/
				mipmap_image(
						img, width, height, channels,
						resampled,
						(1 << MIPlevel), (1 << MIPlevel) );
				/*  upload the MIPmaps	*/
				if( DXT_mode == SOIL_CAPABILITY_PRESENT )
				{
					/*	user wants me to do the DXT conversion!	*/
					int DDS_size;
					unsigned char *DDS_data = NULL;
					if( (channels & 1) == 1 )
					{
						/*	RGB, use DXT1	*/
						DDS_data = convert_image_to_DXT1(
								resampled, MIPwidth, MIPheight, channels, &DDS_size );
					} else
					{
						/*	RGBA, use DXT5	*/
						DDS_data = convert_image_to_DXT5(
								resampled, MIPwidth, MIPheight, channels, &DDS_size );
					}
					if( DDS_data )
					{
						soilGlCompressedTexImage2D(
							opengl_texture_target, MIPlevel,
							internal_texture_format, MIPwidth, MIPheight, 0,
							DDS_size, DDS_data );
						check_for_GL_errors( "glCompressedTexImage2D" );
						SOIL_free_image_data( DDS_data );
					} else
					{
						/*	my compression failed, try the OpenGL driver's version	*/
						glTexImage2D(
							opengl_texture_target, MIPlevel,
							internal_texture_format, MIPwidth, MIPheight, 0,
							original_texture_format, GL_UNSIGNED_BYTE, resampled );
						check_for_GL_errors( "glTexImage2D" );
					}
				} else
				{
					/*	user want OpenGL to do all the work!	*/
					glTexImage2D(
						opengl_texture_target, MIPlevel,
						internal_texture_format, MIPwidth, MIPheight, 0,
						original_texture_format, GL_UNSIGNED_BYTE, resampled );
					check_for_GL_errors( "glTexImage2D" );
				}
				/*	prep for the next level	*/
				++MIPlevel;
				MIPwidth = (MIPwidth + 1) / 2;
				MIPheight = (MIPheight + 1) / 2;
			}
			SOIL_free_image_data( resampled );
			/*	instruct OpenGL to use the MIPmaps	*/
			glTexParameteri( opengl_texture_type, GL_TEXTURE_MAG_FILTER, GL_LINEAR );
			glTexParameteri( opengl_texture_type, GL_TEXTURE_MIN_FILTER, GL_LINEAR_MIPMAP_LINEAR );
			check_for_GL_errors( "GL_TEXTURE_MIN/MAG_FILTER" );
		} else
		{
			/*	instruct OpenGL _NOT_ to use the MIPmaps	*/
			glTexParameteri( opengl_texture_type, GL_TEXTURE_MAG_FILTER, GL_LINEAR );
			glTexParameteri( opengl_texture_type, GL_TEXTURE_MIN_FILTER, GL_LINEAR );
			check_for_GL_errors( "GL_TEXTURE_MIN/MAG_FILTER" );
		}
		/*	does the user want clamping, or wrapping?	*/
		if( flags & SOIL_FLAG_TEXTURE_REPEATS )
		{
			glTexParameteri( opengl_texture_type, GL_TEXTURE_WRAP_S, GL_REPEAT );
			glTexParameteri( opengl_texture_type, GL_TEXTURE_WRAP_T, GL_REPEAT );
			if( opengl_texture_type == SOIL_TEXTURE_CUBE_MAP )
			{
				/*	SOIL_TEXTURE_WRAP_R is invalid if cubemaps aren't supported	*/
				glTexParameteri( opengl_texture_type, SOIL_TEXTURE_WRAP_R, GL_REPEAT );
			}
			check_for_GL_errors( "GL_TEXTURE_WRAP_*" );
		} else
		{
			/*	unsigned int clamp_mode = SOIL_CLAMP_TO_EDGE;	*/
			unsigned int clamp_mode = GL_CLAMP;
			glTexParameteri( opengl_texture_type, GL_TEXTURE_WRAP_S, clamp_mode );
			glTexParameteri( opengl_texture_type, GL_TEXTURE_WRAP_T, clamp_mode );
			if( opengl_texture_type == SOIL_TEXTURE_CUBE_MAP )
			{
				/*	SOIL_TEXTURE_WRAP_R is invalid if cubemaps aren't supported	*/
				glTexParameteri( opengl_texture_type, SOIL_TEXTURE_WRAP_R, clamp_mode );
			}
			check_for_GL_errors( "GL_TEXTURE_WRAP_*" );
		}
		/*	done	*/
		result_string_pointer = "Image loaded as an OpenGL texture";
	} else
	{
		/*	failed	*/
		result_string_pointer = "Failed to generate an OpenGL texture name; missing OpenGL context?";
	}
	SOIL_free_image_data( img );
	return tex_id;
}